

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bighexdump.cpp
# Opt level: O1

string * dumpstrings_abi_cxx11_
                   (string *__return_storage_ptr__,uint8_t *buf,size_t len,size_t *usedlen)

{
  byte *args;
  size_t sVar1;
  long *plVar2;
  bool bVar3;
  int iVar4;
  void *pvVar5;
  byte bVar6;
  char *__s;
  bool bVar7;
  bool bVar8;
  ulong uVar9;
  byte bVar10;
  bool bVar11;
  string escapecode;
  string escaped;
  string local_a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_88;
  size_t local_80;
  long *local_78;
  size_t local_70;
  long local_68 [2];
  ulong *local_58;
  string local_50;
  
  local_88 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_88;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  local_78 = local_68;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"\n\r\t","");
  local_80 = len;
  if (len == 0) {
    uVar9 = 0;
    bVar3 = false;
  }
  else {
    bVar3 = false;
    uVar9 = 0;
    bVar8 = false;
    bVar11 = false;
    local_58 = usedlen;
    do {
      plVar2 = local_78;
      bVar6 = buf[uVar9];
      if (local_70 == 0) {
LAB_001161be:
        bVar7 = bVar6 == 0x5c || bVar6 == 0x22;
      }
      else {
        pvVar5 = memchr(local_78,(int)(char)bVar6,local_70);
        bVar7 = true;
        if (pvVar5 == (void *)0x0 || (long)pvVar5 - (long)plVar2 == -1) goto LAB_001161be;
      }
      args = buf + uVar9;
      iVar4 = isprint((uint)bVar6);
      sVar1 = local_80;
      if ((bVar7) || (iVar4 != 0)) {
        if (!bVar3) {
          if (__return_storage_ptr__->_M_string_length != 0) {
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                      (__return_storage_ptr__,",");
          }
          bVar3 = true;
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                    (__return_storage_ptr__,"\"");
        }
        if (bVar7) {
          local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
          local_a8._M_string_length = 0;
          local_a8.field_2._M_local_buf[0] = '\0';
          bVar6 = *args;
          if (bVar6 < 0xd) {
            if (bVar6 == 9) {
              __s = "\\t";
              goto LAB_0011630b;
            }
            if (bVar6 == 10) {
              __s = "\\n";
              goto LAB_0011630b;
            }
LAB_001163bc:
            stringformat<unsigned_char_const&>(&local_50,"\\x%02x",args);
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            operator=(&local_a8,&local_50);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_50._M_dataplus._M_p != &local_50.field_2) {
              operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
            }
          }
          else {
            __s = "\\r";
            if (bVar6 != 0xd) {
              if (bVar6 == 0x22) {
                __s = "\\\"";
              }
              else {
                if (bVar6 != 0x5c) goto LAB_001163bc;
                __s = "\\\\";
              }
            }
LAB_0011630b:
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            _M_replace(&local_a8,0,0,__s,2);
          }
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                    (__return_storage_ptr__,local_a8._M_dataplus._M_p,local_a8._M_string_length);
          goto LAB_00116332;
        }
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                  (__return_storage_ptr__,*args);
      }
      else {
        if (bVar3) {
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                    (__return_storage_ptr__,"\"");
          bVar3 = false;
        }
        if (__return_storage_ptr__->_M_string_length != 0) {
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                    (__return_storage_ptr__,",");
        }
        stringformat<unsigned_char_const&>(&local_a8,"%02x",args);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                  (__return_storage_ptr__,local_a8._M_dataplus._M_p,local_a8._M_string_length);
LAB_00116332:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
          operator_delete(local_a8._M_dataplus._M_p,
                          CONCAT71(local_a8.field_2._M_allocated_capacity._1_7_,
                                   local_a8.field_2._M_local_buf[0]) + 1);
        }
      }
      bVar6 = 1;
      if (uVar9 + 1 < sVar1) {
        bVar7 = bVar8;
        if (uVar9 == 0) {
          bVar6 = *args;
          bVar11 = true;
          bVar7 = true;
          if ((bVar6 != 10) && (bVar6 != 0xd)) {
            bVar11 = bVar6 == 0;
            bVar7 = bVar11;
          }
        }
        bVar8 = (bool)((byte)(0x2401 >> (buf[uVar9 + 1] & 0x1f)) & buf[uVar9 + 1] < 0xe);
        bVar10 = bVar11 ^ 1;
        bVar6 = bVar10 | bVar8;
        bVar11 = bVar8;
        if (bVar10 == 0 && bVar8 == false) {
          uVar9 = uVar9 + 1;
          bVar11 = bVar7;
          bVar8 = bVar7;
        }
      }
      usedlen = local_58;
    } while ((bVar6 != 0) && (uVar9 = uVar9 + 1, uVar9 < sVar1));
  }
  if (bVar3) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (__return_storage_ptr__,"\"");
  }
  *usedlen = uVar9;
  if (local_78 != local_68) {
    operator_delete(local_78,local_68[0] + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string dumpstrings(const uint8_t *buf, size_t len, size_t &usedlen)
{
    std::string result;
    bool bQuoted= false;
    bool bThisIsEolChar= false;
    std::string escaped= "\n\r\t";

    size_t i;
    for (i=0 ; i<len ; i++)
    {
        bool bNeedsEscape= escaped.find((char)buf[i])!=escaped.npos 
            || buf[i]=='\"' 
            || buf[i]=='\\';

        if (isprint(buf[i]) || bNeedsEscape) {
            if (!bQuoted) {
                if (!result.empty())
                    result += ",";
                result += "\"";
                bQuoted= true;
            }
            if (bNeedsEscape) {
                std::string escapecode;
                switch(buf[i]) {
                    case '\n': escapecode= "\\n"; break;
                    case '\r': escapecode= "\\r"; break;
                    case '\t': escapecode= "\\t"; break;
                    case '\"': escapecode= "\\\""; break;
                    case '\\': escapecode= "\\\\"; break;
                    default:
                       escapecode= stringformat("\\x%02x", buf[i]);
                }
                result += escapecode;
            }
            else {
                result += (char) buf[i];
            }
        }
        else {
            if (bQuoted) {
                result += "\"";
                bQuoted= false;
            }
            if (!result.empty())
                result += ",";
            result += stringformat("%02x", buf[i]);
        }
        if (i+1<len) {
            if (i==0)
                bThisIsEolChar = (buf[i]==0x0a || buf[i]==0x0d || buf[i]==0);

            bool bNextIsEolChar= (buf[i+1]==0x0a || buf[i+1]==0x0d || buf[i+1]==0);
            if (bThisIsEolChar && !bNextIsEolChar) {
                i++;
                break;
            }
            bThisIsEolChar= bNextIsEolChar;
        }
    }

    if (bQuoted) {
        result += "\"";
        bQuoted= false;
    }

    usedlen= i;

    return result;
}